

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.h
# Opt level: O0

void __thiscall
capnp::Orphan<capnp::DynamicValue>::Orphan<capnp::Text>
          (Orphan<capnp::DynamicValue> *this,Orphan<capnp::Text> *other)

{
  Builder value;
  OrphanBuilder *builder;
  BuilderFor<capnp::Text> local_70;
  Builder local_58;
  OrphanBuilder *local_18;
  Orphan<capnp::Text> *other_local;
  Orphan<capnp::DynamicValue> *this_local;
  
  local_18 = &other->builder;
  other_local = (Orphan<capnp::Text> *)this;
  capnp::Orphan<capnp::Text>::get(&local_70,other);
  value.content.ptr = local_70.content.ptr;
  value._0_8_ = local_70._0_8_;
  value.content.size_ = local_70.content.size_;
  DynamicValue::Builder::Builder(&local_58,value);
  builder = kj::mv<capnp::_::OrphanBuilder>(local_18);
  Orphan(this,&local_58,builder);
  DynamicValue::Builder::~Builder(&local_58);
  return;
}

Assistant:

inline Orphan<DynamicValue>::Orphan(Orphan<T>&& other)
    : Orphan(other.get(), kj::mv(other.builder)) {}